

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

void lhCellDiscard(lhcell *pCell)

{
  lhpage *plVar1;
  lhpage *pPage;
  lhcell *pCell_local;
  
  plVar1 = pCell->pPage->pMaster;
  if (pCell->pPrevCol == (lhcell *)0x0) {
    plVar1->apCell[pCell->nHash & plVar1->nCellSize - 1] = pCell->pNextCol;
  }
  else {
    pCell->pPrevCol->pNextCol = pCell->pNextCol;
  }
  if (pCell->pNextCol != (lhcell *)0x0) {
    pCell->pNextCol->pPrevCol = pCell->pPrevCol;
  }
  if (plVar1->pList == pCell) {
    plVar1->pList = plVar1->pList->pNext;
  }
  if (pCell->pPrev != (lhcell *)0x0) {
    pCell->pPrev->pNext = pCell->pNext;
  }
  if (pCell->pNext != (lhcell *)0x0) {
    pCell->pNext->pPrev = pCell->pPrev;
  }
  if (pCell == plVar1->pFirst) {
    plVar1->pFirst = pCell->pPrev;
  }
  plVar1->nCell = plVar1->nCell - 1;
  SyBlobRelease(&pCell->sKey);
  SyMemBackendPoolFree(&plVar1->pHash->sAllocator,pCell);
  return;
}

Assistant:

static void lhCellDiscard(lhcell *pCell)
{
	lhpage *pPage = pCell->pPage->pMaster;	
	
	if( pCell->pPrevCol ){
		pCell->pPrevCol->pNextCol = pCell->pNextCol;
	}else{
		pPage->apCell[pCell->nHash & (pPage->nCellSize - 1)] = pCell->pNextCol;
	}
	if( pCell->pNextCol ){
		pCell->pNextCol->pPrevCol = pCell->pPrevCol;
	}
	MACRO_LD_REMOVE(pPage->pList,pCell);
	if( pCell == pPage->pFirst ){
		pPage->pFirst = pCell->pPrev;
	}
	pPage->nCell--;
	/* Release the cell */
	SyBlobRelease(&pCell->sKey);
	SyMemBackendPoolFree(&pPage->pHash->sAllocator,pCell);
}